

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O0

size_t FSE_decompress_usingDTable
                 (void *dst,size_t originalSize,void *cSrc,size_t cSrcSize,FSE_DTable *dt)

{
  uchar uVar1;
  uint uVar2;
  BIT_DStream_status BVar3;
  uchar *puVar4;
  BYTE *pBVar5;
  U32 fastMode;
  FSE_DTableHeader *DTableH;
  void *ptr;
  FSE_DTable *dt_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t originalSize_local;
  void *dst_local;
  size_t e_1;
  FSE_DState_t state2_1;
  FSE_DState_t state1_1;
  BIT_DStream_t bitD_1;
  BYTE *olimit_1;
  BYTE *omax_1;
  BYTE *op_1;
  BYTE *ostart_1;
  BYTE *local_b8;
  size_t e;
  FSE_DState_t state2;
  FSE_DState_t state1;
  BIT_DStream_t bitD;
  BYTE *olimit;
  BYTE *omax;
  BYTE *op;
  BYTE *ostart;
  BYTE *local_10;
  
  if (*(short *)((long)dt + 2) == 0) {
    local_b8 = (BYTE *)BIT_initDStream((BIT_DStream_t *)&state1_1.table,cSrc,cSrcSize);
    uVar2 = ERR_isError((size_t)local_b8);
    if (uVar2 == 0) {
      FSE_initDState((FSE_DState_t *)&state2_1.table,(BIT_DStream_t *)&state1_1.table,dt);
      FSE_initDState((FSE_DState_t *)&e_1,(BIT_DStream_t *)&state1_1.table,dt);
      for (omax_1 = (BYTE *)dst; BVar3 = BIT_reloadDStream((BIT_DStream_t *)&state1_1.table),
          pBVar5 = omax_1,
          BVar3 == BIT_DStream_unfinished && omax_1 < (BYTE *)((long)dst + (originalSize - 3));
          omax_1 = omax_1 + 4) {
        uVar1 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,(BIT_DStream_t *)&state1_1.table);
        *omax_1 = uVar1;
        uVar1 = FSE_decodeSymbol((FSE_DState_t *)&e_1,(BIT_DStream_t *)&state1_1.table);
        omax_1[1] = uVar1;
        uVar1 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,(BIT_DStream_t *)&state1_1.table);
        omax_1[2] = uVar1;
        uVar1 = FSE_decodeSymbol((FSE_DState_t *)&e_1,(BIT_DStream_t *)&state1_1.table);
        omax_1[3] = uVar1;
      }
      do {
        omax_1 = pBVar5;
        if ((BYTE *)((long)dst + (originalSize - 2)) < omax_1) {
          local_b8 = (BYTE *)0xffffffffffffffba;
          goto LAB_008312d1;
        }
        uVar1 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,(BIT_DStream_t *)&state1_1.table);
        puVar4 = omax_1 + 1;
        *omax_1 = uVar1;
        BVar3 = BIT_reloadDStream((BIT_DStream_t *)&state1_1.table);
        if (BVar3 == BIT_DStream_overflow) {
          uVar1 = FSE_decodeSymbol((FSE_DState_t *)&e_1,(BIT_DStream_t *)&state1_1.table);
          omax_1 = omax_1 + 2;
          *puVar4 = uVar1;
          goto LAB_008312b9;
        }
        if ((uchar *)((long)dst + (originalSize - 2)) < puVar4) {
          local_b8 = (BYTE *)0xffffffffffffffba;
          goto LAB_008312d1;
        }
        uVar1 = FSE_decodeSymbol((FSE_DState_t *)&e_1,(BIT_DStream_t *)&state1_1.table);
        pBVar5 = omax_1 + 2;
        *puVar4 = uVar1;
        BVar3 = BIT_reloadDStream((BIT_DStream_t *)&state1_1.table);
      } while (BVar3 != BIT_DStream_overflow);
      uVar1 = FSE_decodeSymbol((FSE_DState_t *)&state2_1.table,(BIT_DStream_t *)&state1_1.table);
      omax_1 = omax_1 + 3;
      *pBVar5 = uVar1;
LAB_008312b9:
      local_b8 = omax_1 + -(long)dst;
    }
LAB_008312d1:
    dst_local = local_b8;
  }
  else {
    local_10 = (BYTE *)BIT_initDStream((BIT_DStream_t *)&state1.table,cSrc,cSrcSize);
    uVar2 = ERR_isError((size_t)local_10);
    if (uVar2 == 0) {
      FSE_initDState((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table,dt);
      FSE_initDState((FSE_DState_t *)&e,(BIT_DStream_t *)&state1.table,dt);
      for (omax = (BYTE *)dst; BVar3 = BIT_reloadDStream((BIT_DStream_t *)&state1.table),
          pBVar5 = omax,
          BVar3 == BIT_DStream_unfinished && omax < (BYTE *)((long)dst + (originalSize - 3));
          omax = omax + 4) {
        uVar1 = FSE_decodeSymbolFast((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
        *omax = uVar1;
        uVar1 = FSE_decodeSymbolFast((FSE_DState_t *)&e,(BIT_DStream_t *)&state1.table);
        omax[1] = uVar1;
        uVar1 = FSE_decodeSymbolFast((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
        omax[2] = uVar1;
        uVar1 = FSE_decodeSymbolFast((FSE_DState_t *)&e,(BIT_DStream_t *)&state1.table);
        omax[3] = uVar1;
      }
      do {
        omax = pBVar5;
        if ((BYTE *)((long)dst + (originalSize - 2)) < omax) {
          local_10 = (BYTE *)0xffffffffffffffba;
          goto LAB_00830df4;
        }
        uVar1 = FSE_decodeSymbolFast((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
        puVar4 = omax + 1;
        *omax = uVar1;
        BVar3 = BIT_reloadDStream((BIT_DStream_t *)&state1.table);
        if (BVar3 == BIT_DStream_overflow) {
          uVar1 = FSE_decodeSymbolFast((FSE_DState_t *)&e,(BIT_DStream_t *)&state1.table);
          omax = omax + 2;
          *puVar4 = uVar1;
          goto LAB_00830de5;
        }
        if ((uchar *)((long)dst + (originalSize - 2)) < puVar4) {
          local_10 = (BYTE *)0xffffffffffffffba;
          goto LAB_00830df4;
        }
        uVar1 = FSE_decodeSymbolFast((FSE_DState_t *)&e,(BIT_DStream_t *)&state1.table);
        pBVar5 = omax + 2;
        *puVar4 = uVar1;
        BVar3 = BIT_reloadDStream((BIT_DStream_t *)&state1.table);
      } while (BVar3 != BIT_DStream_overflow);
      uVar1 = FSE_decodeSymbolFast((FSE_DState_t *)&state2.table,(BIT_DStream_t *)&state1.table);
      omax = omax + 3;
      *pBVar5 = uVar1;
LAB_00830de5:
      local_10 = omax + -(long)dst;
    }
LAB_00830df4:
    dst_local = local_10;
  }
  return (size_t)dst_local;
}

Assistant:

size_t FSE_decompress_usingDTable(void* dst, size_t originalSize,
                            const void* cSrc, size_t cSrcSize,
                            const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* DTableH = (const FSE_DTableHeader*)ptr;
    const U32 fastMode = DTableH->fastMode;

    /* select fast mode (static) */
    if (fastMode) return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 1);
    return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 0);
}